

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O2

void absl::lts_20250127::container_internal::ConvertDeletedToEmptyAndFullToDeleted
               (ctrl_t *ctrl,size_t capacity)

{
  undefined8 uVar1;
  ctrl_t *pos;
  ctrl_t *pcVar2;
  ctrl_t *pcVar3;
  
  if (ctrl[capacity] != kSentinel) {
    __assert_fail("ctrl[capacity] == ctrl_t::kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x9e,
                  "void absl::container_internal::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  if ((capacity != 0) && ((capacity + 1 & capacity) == 0)) {
    pcVar3 = ctrl + capacity;
    for (pcVar2 = ctrl; pcVar2 < pcVar3; pcVar2 = pcVar2 + 0x10) {
      *pcVar2 = -(*pcVar2 < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[1] = -(pcVar2[1] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[2] = -(pcVar2[2] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[3] = -(pcVar2[3] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[4] = -(pcVar2[4] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[5] = -(pcVar2[5] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[6] = -(pcVar2[6] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[7] = -(pcVar2[7] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[8] = -(pcVar2[8] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[9] = -(pcVar2[9] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[10] = -(pcVar2[10] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[0xb] = -(pcVar2[0xb] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[0xc] = -(pcVar2[0xc] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[0xd] = -(pcVar2[0xd] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[0xe] = -(pcVar2[0xe] < ~kSentinel) & 0x7e ^ kDeleted;
      pcVar2[0xf] = -(pcVar2[0xf] < ~kSentinel) & 0x7e ^ kDeleted;
    }
    uVar1 = *(undefined8 *)ctrl;
    *(undefined8 *)(pcVar3 + 8) = *(undefined8 *)(ctrl + 7);
    *(undefined8 *)(pcVar3 + 1) = uVar1;
    *pcVar3 = kSentinel;
    return;
  }
  __assert_fail("IsValidCapacity(capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0x9f,
                "void absl::container_internal::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
               );
}

Assistant:

void ConvertDeletedToEmptyAndFullToDeleted(ctrl_t* ctrl, size_t capacity) {
  assert(ctrl[capacity] == ctrl_t::kSentinel);
  assert(IsValidCapacity(capacity));
  for (ctrl_t* pos = ctrl; pos < ctrl + capacity; pos += Group::kWidth) {
    Group{pos}.ConvertSpecialToEmptyAndFullToDeleted(pos);
  }
  // Copy the cloned ctrl bytes.
  std::memcpy(ctrl + capacity + 1, ctrl, NumClonedBytes());
  ctrl[capacity] = ctrl_t::kSentinel;
}